

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O1

BasicBlock * __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::CreateBasicBlock(LoopUnswitch *this,iterator ip)

{
  IRContext *pIVar1;
  pointer puVar2;
  mapped_type pBVar3;
  const_iterator cVar4;
  UptrVector *pUVar5;
  uint32_t res_id;
  tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_> tVar6;
  Instruction *this_00;
  mapped_type *ppBVar7;
  pointer *__ptr;
  string message;
  size_type __dnew;
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  local_98;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> *local_90
  ;
  LoopUnswitch *local_88;
  const_iterator local_80;
  UptrVector *local_78;
  DefUseManager *local_70;
  undefined1 local_68 [32];
  spv_position_t local_48;
  
  local_80._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       ip.iterator_._M_current;
  local_78 = ip.container_;
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  local_70 = (pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  tVar6.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        )operator_new(0x88);
  this_00 = (Instruction *)operator_new(0x70);
  pIVar1 = this->context_;
  res_id = Module::TakeNextIdBound
                     ((pIVar1->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    local_90 = &pIVar1->consumer_;
    local_68._0_8_ = local_68 + 0x10;
    local_48.line = 0x25;
    local_88 = this;
    local_68._0_8_ = std::__cxx11::string::_M_create((ulong *)local_68,(ulong)&local_48);
    local_68._16_8_ = local_48.line;
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    _vptr_IntrusiveNodeBase = (_func_int **)0x667265766f204449;
    ((OperandData *)
    &(((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_)->
    _vptr_SmallVector = (_func_int **)0x797254202e776f6c;
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_
         = (Instruction *)0x676e696e6e757220;
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ =
         true;
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x19 =
         'c';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1a =
         'o';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1b =
         'm';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1c =
         'p';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1d =
         'a';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1e =
         'c';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1f =
         't';
    *(undefined8 *)
     &(((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1d =
         0x2e7364692d746361;
    local_68._8_8_ = local_48.line;
    *(undefined1 *)
     ((long)&(((key_type)(local_68._0_8_ + -0x70))->dbg_line_insts_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start +
     (long)(((OperandData *)(local_48.line + 8))->buffer + 2)) = 0;
    local_48.line = 0;
    local_48.column = 0;
    local_48.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(local_90,SPV_MSG_ERROR,"",&local_48,(char *)local_68._0_8_);
    this = local_88;
    if ((key_type)local_68._0_8_ != (key_type)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,
                      (ulong)((long)(spv_operand_type_t *)local_68._16_8_ + 1));
      this = local_88;
    }
  }
  local_68._0_8_ = (key_type)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_68._16_8_ = (pointer)0x0;
  Instruction::Instruction(this_00,pIVar1,OpLabel,0,res_id,(OperandList *)local_68);
  pUVar5 = local_78;
  cVar4._M_current = local_80._M_current;
  *(undefined8 *)
   tVar6.
   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = 0;
  (((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 8))->_M_t).
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = this_00;
  *(Instruction **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x20) =
       (Instruction *)0x0;
  *(Instruction **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x28) =
       (Instruction *)0x0;
  (((Instruction *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x18))->
  super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_00948898;
  *(uint32_t *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x48) = 0;
  *(IRContext **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x38) =
       (IRContext *)0x0;
  *(undefined8 *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x3e) = 0;
  (((OperandList *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x50))->
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x58) =
       (pointer)0x0;
  *(pointer *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x60) =
       (pointer)0x0;
  (((vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x68))->
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x70) =
       (pointer)0x0;
  *(pointer *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x78) =
       (pointer)0x0;
  ((DebugScope *)
  ((long)tVar6.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x80))->
  lexical_scope_ = 0;
  ((DebugScope *)
  ((long)tVar6.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x80))->
  inlined_at_ = 0;
  *(Instruction **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x20) =
       (Instruction *)
       ((long)tVar6.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x18);
  *(Instruction **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x28) =
       (Instruction *)
       ((long)tVar6.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x18);
  *(bool *)((long)tVar6.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x30) =
       true;
  (((InstructionList *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x10))->
  super_IntrusiveList<spvtools::opt::Instruction>)._vptr_IntrusiveList =
       (_func_int **)&PTR__InstructionList_00948930;
  puVar2 = (local_78->
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_98._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>)
       (tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>)
       tVar6.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::_M_insert_rval(local_78,local_80,(value_type *)&local_98);
  pBVar3 = *(mapped_type *)
            ((long)cVar4._M_current +
            ((long)(pUVar5->
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start - (long)puVar2));
  if ((_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       )local_98._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl != (BasicBlock *)0x0
     ) {
    std::default_delete<spvtools::opt::BasicBlock>::operator()
              ((default_delete<spvtools::opt::BasicBlock> *)&local_98,
               (BasicBlock *)
               local_98._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  }
  local_98._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>)
       (_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        )0x0;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_68);
  pBVar3->function_ = this->function_;
  analysis::DefUseManager::AnalyzeInstDef
            (local_70,(pBVar3->label_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  local_68._0_8_ =
       (pBVar3->label_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if ((this->context_->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    ppBVar7 = std::__detail::
              _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->context_->instr_to_block_,(key_type *)local_68);
    *ppBVar7 = pBVar3;
  }
  return pBVar3;
}

Assistant:

BasicBlock* CreateBasicBlock(Function::iterator ip) {
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

    // TODO(1841): Handle id overflow.
    BasicBlock* bb = &*ip.InsertBefore(std::unique_ptr<BasicBlock>(
        new BasicBlock(std::unique_ptr<Instruction>(new Instruction(
            context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})))));
    bb->SetParent(function_);
    def_use_mgr->AnalyzeInstDef(bb->GetLabelInst());
    context_->set_instr_block(bb->GetLabelInst(), bb);

    return bb;
  }